

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

void ConvolutionReverb::SetupImpulse(EffectData *data,int numchannels,int blocksize,int samplerate)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int n_3;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  UnityComplexNumber *pUVar14;
  Channel *pCVar15;
  float *pfVar16;
  long lVar17;
  UnityComplexNumber **ppUVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int n_1;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int k;
  long lVar26;
  uint uVar27;
  size_t sVar28;
  size_t sVar29;
  ulong uVar30;
  int n;
  ulong uVar31;
  int i;
  long lVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  double dVar41;
  uint local_b0;
  MutexScopeLock mutexScope2;
  MutexScopeLock mutexScope1;
  
  mutexScope1.mutex = data->mutex;
  Mutex::Lock(mutexScope1.mutex);
  uVar10 = (uint)data->p[9];
  uVar23 = (ulong)uVar10;
  if (((data->numchannels == numchannels) && (data->hopsize == blocksize)) &&
     (data->samplerate == samplerate)) {
    if ((data->lastparams[2] == data->p[2]) && (!NAN(data->lastparams[2]) && !NAN(data->p[2]))) {
      if ((data->lastparams[3] == data->p[3]) && (!NAN(data->lastparams[3]) && !NAN(data->p[3]))) {
        if ((data->lastparams[4] == data->p[4]) && (!NAN(data->lastparams[4]) && !NAN(data->p[4])))
        {
          if ((data->lastparams[5] == data->p[5]) && (!NAN(data->lastparams[5]) && !NAN(data->p[5]))
             ) {
            if ((data->lastparams[6] == data->p[6]) &&
               (!NAN(data->lastparams[6]) && !NAN(data->p[6]))) {
              if ((data->lastparams[7] == data->p[7]) &&
                 (!NAN(data->lastparams[7]) && !NAN(data->p[7]))) {
                if (((data->lastparams[8] == data->p[8]) &&
                    (!NAN(data->lastparams[8]) && !NAN(data->p[8]))) &&
                   ((int)data->lastparams[9] == uVar10)) {
                  if ((data->lastparams[10] == data->p[10]) &&
                     (!NAN(data->lastparams[10]) && !NAN(data->p[10]))) {
                    if ((int)uVar10 < 0) goto LAB_0010e2bd;
                    if (GetIRSample(int)::initialized == '\0') {
                      memset(GetIRSample(int)::samples,0,0x4200);
                      GetIRSample(int)::initialized = '\x01';
                    }
                    if (*(int *)(GetIRSample(int)::samples + uVar23 * 0x420 + 0x14) ==
                        globalupdatecount) goto LAB_0010e2bd;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  mutexScope2.mutex = (Mutex *)sampleMutex;
  Mutex::Lock((Mutex *)sampleMutex);
  for (lVar32 = 0; pCVar15 = data->channels, lVar32 < data->numchannels; lVar32 = lVar32 + 1) {
    pCVar15 = pCVar15 + lVar32;
    for (lVar26 = 0; ppUVar18 = pCVar15->h, lVar26 < data->numpartitions; lVar26 = lVar26 + 1) {
      if (ppUVar18[lVar26] != (UnityComplexNumber *)0x0) {
        operator_delete__(ppUVar18[lVar26]);
      }
      if (pCVar15->x[lVar26] != (UnityComplexNumber *)0x0) {
        operator_delete__(pCVar15->x[lVar26]);
      }
    }
    if (ppUVar18 != (UnityComplexNumber **)0x0) {
      operator_delete__(ppUVar18);
    }
    if (pCVar15->x != (UnityComplexNumber **)0x0) {
      operator_delete__(pCVar15->x);
    }
    if (pCVar15->s != (float *)0x0) {
      operator_delete__(pCVar15->s);
    }
    if (pCVar15->impulse != (float *)0x0) {
      operator_delete__(pCVar15->impulse);
    }
  }
  if (pCVar15 != (Channel *)0x0) {
    operator_delete__(pCVar15);
  }
  if (data->tmpoutput != (UnityComplexNumber *)0x0) {
    operator_delete__(data->tmpoutput);
  }
  uVar5 = *(undefined8 *)data->p;
  uVar6 = *(undefined8 *)(data->p + 2);
  uVar7 = *(undefined8 *)(data->p + 4);
  uVar8 = *(undefined8 *)(data->p + 6);
  uVar9 = *(undefined8 *)(data->p + 9);
  *(undefined8 *)(data->lastparams + 7) = *(undefined8 *)(data->p + 7);
  *(undefined8 *)(data->lastparams + 9) = uVar9;
  *(undefined8 *)(data->lastparams + 4) = uVar7;
  *(undefined8 *)(data->lastparams + 6) = uVar8;
  *(undefined8 *)data->lastparams = uVar5;
  *(undefined8 *)(data->lastparams + 2) = uVar6;
  data->bufferindex = 0;
  data->writeoffset = 0;
  data->numchannels = numchannels;
  data->hopsize = blocksize;
  data->fftsize = blocksize * 2;
  sVar29 = (long)(blocksize * 2) << 3;
  sVar28 = sVar29;
  if (blocksize < 0) {
    sVar28 = 0xffffffffffffffff;
  }
  pUVar14 = (UnityComplexNumber *)operator_new__(sVar28);
  data->tmpoutput = pUVar14;
  uVar21 = (ulong)(uint)numchannels << 5;
  if (numchannels < 0) {
    uVar21 = 0xffffffffffffffff;
  }
  pCVar15 = (Channel *)operator_new__(uVar21);
  data->channels = pCVar15;
  data->samplerate = samplerate;
  memset(pUVar14,0,sVar29);
  fVar33 = (float)samplerate;
  if ((int)uVar10 < 0) {
    fVar34 = ceilf(data->p[2] * fVar33);
    iVar19 = (int)fVar34;
  }
  else {
    if (GetIRSample(int)::initialized == '\0') {
      memset(GetIRSample(int)::samples,0,0x4200);
      GetIRSample(int)::initialized = '\x01';
    }
    if (*(int *)(GetIRSample(int)::samples + uVar23 * 0x420 + 8) == 0) {
      iVar19 = 0x100;
    }
    else {
      fVar34 = ceilf(((float)*(int *)(GetIRSample(int)::samples + uVar23 * 0x420 + 8) * fVar33) /
                     (float)*(int *)(GetIRSample(int)::samples + uVar23 * 0x420 + 0x10));
      iVar19 = (int)fVar34;
    }
  }
  iVar1 = data->hopsize;
  iVar11 = 0;
  if (0 < iVar19) {
    iVar11 = iVar19;
  }
  iVar11 = (iVar11 - (uint)(0 < iVar19)) / (iVar1 + (uint)(iVar1 == 0)) + (uint)(0 < iVar19);
  uVar27 = iVar1 * iVar11;
  data->numpartitions = iVar11;
  lVar32 = uVar23 * 0x420;
  uVar23 = 0;
  if (0 < numchannels) {
    uVar23 = (ulong)(uint)numchannels;
  }
  uVar21 = (ulong)(uint)((int)uVar27 >> 1);
  if ((int)uVar27 >> 1 < 1) {
    uVar21 = 0;
  }
  uVar22 = (long)(int)uVar27 * 4;
  if ((int)uVar27 < 0) {
    uVar22 = 0xffffffffffffffff;
  }
  uVar30 = 0;
  if (0 < (int)uVar27) {
    uVar30 = (ulong)uVar27;
  }
  for (lVar26 = 0; lVar26 < data->numchannels; lVar26 = lVar26 + 1) {
    pCVar15 = data->channels + lVar26;
    pfVar16 = (float *)operator_new__(uVar22);
    pCVar15->impulse = pfVar16;
    sVar28 = (long)data->fftsize * 4;
    sVar29 = sVar28;
    if ((long)data->fftsize < 0) {
      sVar29 = 0xffffffffffffffff;
    }
    pfVar16 = (float *)operator_new__(sVar29);
    pCVar15->s = pfVar16;
    memset(pfVar16,0,sVar28);
    fVar34 = sinf(data->p[6] * 0.7853982 * (1.0 / fVar33));
    fVar35 = sinf(data->p[7] * 0.7853982 * (1.0 / fVar33));
    local_b0 = local_b0 * 0x19660d + 0x3c6ef35f;
    fVar36 = data->p[8] * -0.89 + 0.9;
    fVar40 = (((float)(local_b0 & 0xffffff ^ local_b0 >> 0x10) * 0.01 * 5.960465e-08 + 0.0) *
              data->p[5] + -1.0) / (data->p[3] * (float)iVar19 * 0.01);
    if ((int)uVar10 < 0) {
      fVar37 = data->p[4];
      for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
        fVar38 = expf((float)(int)uVar31 * fVar40);
        uVar12 = local_b0 * 0x19660d + 0x3c6ef35f;
        fVar39 = powf((float)(uVar12 & 0xffffff ^ uVar12 >> 0x10) * 0.9 * 5.960465e-08 + 0.1,
                      fVar37 * -0.09 + 10.0);
        local_b0 = local_b0 * 0x17385ca9 + 0x47502932;
        pCVar15->impulse[uVar31] =
             fVar39 * fVar38 *
             ((float)((local_b0 & 0xffffff ^ local_b0 >> 0x10) * 2) * 5.960465e-08 + -1.0);
      }
    }
    else {
      if (GetIRSample(int)::initialized == '\0') {
        memset(GetIRSample(int)::samples,0,0x4200);
        GetIRSample(int)::initialized = '\x01';
      }
      if (*(int *)(GetIRSample(int)::samples + lVar32 + 8) == 0) {
        SetupImpulse::dummysample.data = SetupImpulse::dummydata;
        SetupImpulse::dummysample.numsamples = 0x100;
        SetupImpulse::dummysample.numchannels = numchannels;
        SetupImpulse::dummysample.samplerate = samplerate;
        for (lVar17 = 0; uVar23 << 2 != lVar17; lVar17 = lVar17 + 4) {
          *(undefined4 *)((long)SetupImpulse::dummydata + lVar17) = 0x3f800000;
        }
        memcpy(GetIRSample(int)::samples + lVar32,&SetupImpulse::dummysample,0x420);
      }
      iVar1 = *(int *)(GetIRSample(int)::samples + lVar32 + 0x10);
      iVar11 = numchannels + -1;
      if (lVar26 < numchannels) {
        iVar11 = (int)lVar26;
      }
      for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
        fVar37 = (float)(int)uVar31 * ((float)iVar1 / fVar33);
        fVar38 = ceilf(fVar37);
        iVar2 = *(int *)(GetIRSample(int)::samples + lVar32 + 8);
        iVar13 = (int)fVar38;
        if (iVar2 <= (int)fVar38) {
          iVar13 = iVar2 + -1;
        }
        iVar20 = iVar13 + 1;
        if (iVar2 <= iVar13 + 1) {
          iVar20 = iVar2 + -1;
        }
        lVar17 = *(long *)(GetIRSample(int)::samples + lVar32);
        fVar38 = *(float *)(lVar17 + (long)(iVar13 * *(int *)(GetIRSample(int)::samples +
                                                             lVar32 + 0xc) + iVar11) * 4);
        pCVar15->impulse[uVar31] =
             (*(float *)(lVar17 + (long)(iVar20 * *(int *)(GetIRSample(int)::samples + lVar32 + 0xc)
                                        + iVar11) * 4) - fVar38) * (fVar37 - (float)iVar13) + fVar38
        ;
      }
      *(int *)(GetIRSample(int)::samples + lVar32 + 0x14) = globalupdatecount;
    }
    fVar36 = fVar36 * fVar36;
    fVar37 = 0.0;
    fVar38 = 0.0;
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      fVar39 = expf((float)(int)uVar31 * fVar40);
      fVar39 = fVar39 * ((fVar34 + fVar34) - (fVar35 + fVar35)) + fVar35 + fVar35;
      fVar37 = fVar39 * fVar38 + fVar37;
      fVar38 = ((pCVar15->impulse[uVar31] - fVar37) - fVar38 * fVar36) * fVar39 + fVar38;
      fVar37 = fVar39 * fVar38 + fVar37;
      fVar38 = fVar38 - (fVar38 * fVar36 + fVar37) * fVar39;
      pCVar15->impulse[uVar31] = (1.0 - fVar36 * fVar36) * 0.5 * fVar37;
    }
    if (0.5 < data->p[10]) {
      uVar12 = uVar27;
      for (uVar31 = 0; uVar12 = uVar12 - 1, uVar21 != uVar31; uVar31 = uVar31 + 1) {
        pfVar16 = pCVar15->impulse;
        fVar34 = pfVar16[uVar31];
        pfVar16[uVar31] = pfVar16[(int)uVar12];
        pfVar16[(int)uVar12] = fVar34;
      }
    }
    fVar34 = 0.0;
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      fVar34 = fVar34 + pCVar15->impulse[uVar31] * pCVar15->impulse[uVar31];
    }
    if (fVar34 < 0.0) {
      fVar34 = sqrtf(fVar34);
    }
    else {
      fVar34 = SQRT(fVar34);
    }
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      pCVar15->impulse[uVar31] = pCVar15->impulse[uVar31] * (1.0 / fVar34);
    }
    uVar24 = (ulong)data->numpartitions;
    uVar31 = uVar24 * 8;
    if ((long)uVar24 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    ppUVar18 = (UnityComplexNumber **)operator_new__(uVar31);
    pCVar15->h = ppUVar18;
    ppUVar18 = (UnityComplexNumber **)operator_new__(uVar31);
    pCVar15->x = ppUVar18;
    pfVar16 = pCVar15->impulse;
    for (lVar17 = 0; lVar17 < (int)uVar24; lVar17 = lVar17 + 1) {
      sVar28 = (long)data->fftsize * 8;
      sVar29 = sVar28;
      if ((long)data->fftsize < 0) {
        sVar29 = 0xffffffffffffffff;
      }
      pUVar14 = (UnityComplexNumber *)operator_new__(sVar29);
      pCVar15->h[lVar17] = pUVar14;
      pUVar14 = (UnityComplexNumber *)operator_new__(sVar29);
      pCVar15->x[lVar17] = pUVar14;
      memset(pCVar15->x[lVar17],0,sVar28);
      memset(pCVar15->h[lVar17],0,(long)data->fftsize << 3);
      uVar31 = (ulong)(uint)data->hopsize;
      if (data->hopsize < 1) {
        uVar31 = 0;
      }
      for (lVar25 = 0; uVar31 * 4 != lVar25; lVar25 = lVar25 + 4) {
        *(undefined4 *)((long)&pCVar15->h[lVar17]->re + lVar25 * 2) =
             *(undefined4 *)((long)pfVar16 + lVar25);
      }
      FFT::Forward(pCVar15->h[lVar17],data->fftsize,false);
      pfVar16 = (float *)((long)pfVar16 + lVar25);
      uVar24 = (ulong)(uint)data->numpartitions;
    }
    dVar3 = 0.0;
    dVar41 = 0.0;
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      dVar4 = (double)ABS(pCVar15->impulse[uVar31]);
      uVar24 = -(ulong)(dVar41 < dVar4);
      dVar41 = (double)(~uVar24 & (ulong)(dVar41 * 0.9900000095367432 + 9.999999717180685e-10) |
                       (ulong)dVar4 & uVar24);
      dVar3 = dVar3 + dVar41;
      pCVar15->impulse[uVar31] = (float)dVar3;
    }
    dVar41 = 0.0;
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      pCVar15->impulse[uVar31] = pCVar15->impulse[uVar31] - (float)dVar41;
      dVar41 = dVar41 + dVar3 / (double)(int)uVar27;
    }
  }
  MutexScopeLock::~MutexScopeLock(&mutexScope2);
LAB_0010e2bd:
  MutexScopeLock::~MutexScopeLock(&mutexScope1);
  return;
}

Assistant:

static void SetupImpulse(EffectData* data, int numchannels, int blocksize, int samplerate)
    {
        MutexScopeLock mutexScope1(*data->mutex);

        Random random;

        int usesample = (int)data->p[P_USESAMPLE];

        // if no parameters have changed, there's no need to recalculate the impulse
        if (data->numchannels == numchannels &&
            data->hopsize == blocksize &&
            data->samplerate == samplerate &&
            data->lastparams[P_TIME] == data->p[P_TIME] &&
            data->lastparams[P_DECAY] == data->p[P_DECAY] &&
            data->lastparams[P_DIFFUSION] == data->p[P_DIFFUSION] &&
            data->lastparams[P_STEREO] == data->p[P_STEREO] &&
            data->lastparams[P_CUTHI] == data->p[P_CUTHI] &&
            data->lastparams[P_CUTLO] == data->p[P_CUTLO] &&
            data->lastparams[P_RESONANCE] == data->p[P_RESONANCE] &&
            (int)data->lastparams[P_USESAMPLE] == usesample &&
            data->lastparams[P_REVERSE] == data->p[P_REVERSE] &&
            (usesample < 0 || GetIRSample(usesample).updatecount == globalupdatecount)
            )
            return;

        MutexScopeLock mutexScope2(sampleMutex);

        // delete old buffers (can be avoided if numchannels, numpartitions and hopsize stay the same)
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            for (int k = 0; k < data->numpartitions; k++)
            {
                delete[] c.h[k];
                delete[] c.x[k];
            }
            delete[] c.h;
            delete[] c.x;
            delete[] c.s;
            delete[] c.impulse;
        }
        delete[] data->channels;
        delete[] data->tmpoutput;

        memcpy(data->lastparams, data->p, sizeof(data->p));

        // reinitialize data
        data->bufferindex = 0;
        data->writeoffset = 0;
        data->numchannels = numchannels;
        data->hopsize = blocksize;
        data->fftsize = blocksize * 2;
        data->tmpoutput = new UnityComplexNumber[data->fftsize];
        data->channels = new Channel[data->numchannels];
        data->samplerate = samplerate;

        memset(data->tmpoutput, 0, sizeof(UnityComplexNumber) * data->fftsize);

        // calculate length of impulse in samples
        int reallength = (int)ceilf(samplerate * data->p[P_TIME]);
        if (usesample >= 0)
        {
            IRSample& s = GetIRSample(usesample);
            if (s.numsamples == 0)
                reallength = 256;
            else
                reallength = (int)ceilf(s.numsamples * (float)samplerate / (float)s.samplerate);
        }

        // calculate length of impulse in samples as a multiple of the number of partitions processed
        data->numpartitions = 0;
        while (data->numpartitions * data->hopsize < reallength)
            data->numpartitions++;
        int impulsesamples = data->numpartitions * data->hopsize;

        // calculate individual impulse responses per channel
        float sampletime = 1.0f / (float)samplerate;
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            c.impulse = new float[impulsesamples];
            c.s = new float[data->fftsize];
            memset(c.s, 0, sizeof(float) * data->fftsize);

            float cuthi = 2.0f * sinf(0.25f * kPI * data->p[P_CUTHI] * sampletime);
            float cutlo = 2.0f * sinf(0.25f * kPI * data->p[P_CUTLO] * sampletime);
            float bw = 0.9f - 0.89f * data->p[P_RESONANCE]; bw *= bw;
            float decayconst = (data->p[P_STEREO] * random.GetFloat(0.0f, 0.01f) - 1.0f) / (reallength * 0.01f * data->p[P_DECAY]);

            if (usesample < 0)
            {
                // calculate the impulse response as decaying white noise
                float d = 10.0f - 0.09f * data->p[P_DIFFUSION];
                for (int n = 0; n < impulsesamples; n++)
                {
                    float env = expf(decayconst * n);
                    c.impulse[n] = env * powf(random.GetFloat(0.1f, 1.0f), d) * random.GetFloat(-1.0f, 1.0f);
                }
            }
            else
            {
                IRSample& s = GetIRSample(usesample);
                if (s.numsamples == 0)
                {
                    static float dummydata[256 * 8];
                    static IRSample dummysample;
                    dummysample.data = dummydata;
                    dummysample.numchannels = numchannels;
                    dummysample.numsamples = 256;
                    dummysample.samplerate = samplerate;
                    for (int n = 0; n < numchannels; n++)
                        dummydata[n] = 1.0f;
                    s = dummysample;
                }

                int channel = (i < numchannels) ? i : (numchannels - 1);
                float speed = (float)s.samplerate / (float)samplerate;
                for (int n = 0; n < impulsesamples; n++)
                {
                    float fpos = n * speed;
                    int ipos1 = (int)ceilf(fpos);
                    if (ipos1 >= s.numsamples)
                        ipos1 = s.numsamples - 1;
                    int ipos2 = ipos1 + 1;
                    if (ipos2 >= s.numsamples)
                        ipos2 = s.numsamples - 1;
                    fpos -= ipos1;
                    float s1 = s.data[ipos1 * s.numchannels + channel];
                    float s2 = s.data[ipos2 * s.numchannels + channel];
                    c.impulse[n] = s1 + (s2 - s1) * fpos;
                }

                s.updatecount = globalupdatecount;
            }

            float lpf = 0.0f, bpf = 0.0f, gain = 0.5f * (1.0f - bw * bw);
            for (int n = 0; n < impulsesamples; n++)
            {
                float env = expf(decayconst * n);
                float cut = cutlo + (cuthi - cutlo) * env;
                lpf += cut * bpf;
                bpf += cut * (c.impulse[n] - lpf - bpf * bw);
                lpf += cut * bpf;
                bpf -= cut * (lpf + bpf * bw);
                c.impulse[n] = gain * lpf;
                //c.impulse[n] = env * sinf(n * 2.0f * 3.1415926f * 1000.0f / 44100.0f); // damped sine -- useful for debugging with click input signals
            }

            if (data->p[P_REVERSE] > 0.5f)
            {
                int len = impulsesamples >> 1;
                for (int n = 0; n < len; n++)
                {
                    float tmp = c.impulse[n];
                    c.impulse[n] = c.impulse[impulsesamples - 1 - n];
                    c.impulse[impulsesamples - 1 - n] = tmp;
                }
            }

            // measure signal power
            float power = 0.0f;
            for (int n = 0; n < impulsesamples; n++)
                power += c.impulse[n] * c.impulse[n];

            // normalize gain
            float scale = 1.0f / sqrtf(power);
            for (int n = 0; n < impulsesamples; n++)
                c.impulse[n] *= scale;

            // partition the impulse response
            c.h = new UnityComplexNumber*[data->numpartitions];
            c.x = new UnityComplexNumber*[data->numpartitions];
            float* src = c.impulse;
            for (int k = 0; k < data->numpartitions; k++)
            {
                c.h[k] = new UnityComplexNumber[data->fftsize];
                c.x[k] = new UnityComplexNumber[data->fftsize];
                memset(c.x[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                memset(c.h[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                for (int n = 0; n < data->hopsize; n++)
                    c.h[k][n].re = *src++;
                FFT::Forward(c.h[k], data->fftsize, false);
            }

            // integrate peak detection filtered impulse for later resampling via box-filtering when GUI requests preview waveform
            double sum = 0.0, peak = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                float a = fabsf(c.impulse[n]);
                if (a > peak)
                    peak = a;
                else
                    peak = peak * 0.99f + 1.0e-9f;
                sum += peak;
                c.impulse[n] = (float)sum;
            }
            double dc = -sum / (double)impulsesamples;
            sum = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                c.impulse[n] -= (float)sum;
                sum -= dc;
            }
        }
    }